

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf16_inverse.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  static_truth_table<4U,_true> *tt;
  static_truth_table<4U,_true> *func;
  int iVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<kitty::static_truth_table<4U,_true>_> __l_00;
  allocator<char> local_2b0;
  allocator_type local_2af;
  allocator<char> local_2ae;
  allocator<char> local_2ad;
  allocator<char> local_2ac;
  allocator<char> local_2ab;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  allocator<char> local_2a8;
  allocator<char> local_2a7;
  allocator<char> local_2a6;
  allocator<char> local_2a5;
  allocator<char> local_2a4;
  allocator<char> local_2a3;
  allocator<char> local_2a2;
  allocator<char> local_2a1;
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  y;
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  steps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chain;
  vector<kitty::cube,_std::allocator<kitty::cube>_> cubes;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [40];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cubes,"x5 = x3 ^ x4",(allocator<char> *)&steps);
  std::__cxx11::string::string<std::allocator<char>>(local_238,"x6 = x1 & x3",(allocator<char> *)&y)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_218,"x7 = x2 ^ x6",&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"x8 = x1 ^ x2",&local_2a1);
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"x9 = x4 ^ x6",&local_2a2);
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"x10 = x8 & x9",&local_2a3);
  std::__cxx11::string::string<std::allocator<char>>(local_198,"x11 = x5 & x7",&local_2a4);
  std::__cxx11::string::string<std::allocator<char>>(local_178,"x12 = x1 & x4",&local_2a5);
  std::__cxx11::string::string<std::allocator<char>>(local_158,"x13 = x8 & x12",&local_2a6);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"x14 = x8 ^ x13",&local_2a7);
  std::__cxx11::string::string<std::allocator<char>>(local_118,"x15 = x2 & x3",&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"x16 = x5 & x15",&local_2a9);
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"x17 = x5 ^ x16",&local_2aa);
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"x18 = x6 ^ x17",&local_2ab);
  std::__cxx11::string::string<std::allocator<char>>(local_98,"x19 = x4 ^ x11",&local_2ac);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"x20 = x6 ^ x14",&local_2ad);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"x21 = x2 ^ x10",&local_2ae);
  __l._M_len = 0x11;
  __l._M_array = (iterator)&cubes;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&chain,__l,&local_2af);
  lVar3 = 0x200;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&cubes.super__Vector_base<kitty::cube,_std::allocator<kitty::cube>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  steps.
  super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  steps.
  super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  steps.
  super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  kitty::create_multiple_from_chain<kitty::static_truth_table<4u,true>,void>
            (4,&steps,&chain,(string *)0x0);
  cubes.super__Vector_base<kitty::cube,_std::allocator<kitty::cube>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)steps.
                super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start[0x11]._bits;
  cubes.super__Vector_base<kitty::cube,_std::allocator<kitty::cube>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)steps.
                super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start[0x12]._bits;
  cubes.super__Vector_base<kitty::cube,_std::allocator<kitty::cube>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)steps.
                super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start[0x13]._bits;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&cubes;
  std::
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::vector(&y,__l_00,(allocator_type *)&local_2b0);
  iVar2 = 1;
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
    poVar1 = std::operator<<((ostream *)&std::cout,"y");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar2);
    poVar1 = std::operator<<(poVar1," = ");
    kitty::to_hex<kitty::static_truth_table<4u,true>,void>
              ((string *)&cubes,
               (kitty *)((long)&(y.
                                 super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_bits + lVar3),tt);
    poVar1 = std::operator<<(poVar1,(string *)&cubes);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&cubes);
    kitty::esop_from_pprm<kitty::static_truth_table<4u,true>>
              (&cubes,(kitty *)((long)&(y.
                                        super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_bits + lVar3),
               func);
    kitty::print_cubes(&cubes,4,(ostream *)&std::cout);
    std::_Vector_base<kitty::cube,_std::allocator<kitty::cube>_>::~_Vector_base
              ((_Vector_base<kitty::cube,_std::allocator<kitty::cube>_> *)&cubes);
    iVar2 = iVar2 + 1;
  }
  std::ostream::flush();
  std::
  _Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::~_Vector_base(&y.
                   super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                 );
  std::
  _Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::~_Vector_base(&steps.
                   super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                 );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&chain);
  return 0;
}

Assistant:

int main()
{
  /* This is the Boolean chain described in Fig. 1 of [J. Boyar and R. Peralta,
     SEC (2012), 287-298] */
  std::vector<std::string> chain{
      "x5 = x3 ^ x4", "x6 = x1 & x3", "x7 = x2 ^ x6",
      "x8 = x1 ^ x2", "x9 = x4 ^ x6", "x10 = x8 & x9",
      "x11 = x5 & x7", "x12 = x1 & x4", "x13 = x8 & x12",
      "x14 = x8 ^ x13", "x15 = x2 & x3", "x16 = x5 & x15",
      "x17 = x5 ^ x16", "x18 = x6 ^ x17", "x19 = x4 ^ x11",
      "x20 = x6 ^ x14", "x21 = x2 ^ x10"};

  /* create truth tables */
  std::vector<kitty::static_truth_table<4>> steps;
  kitty::create_multiple_from_chain( 4, steps, chain );

  /* output functions are in the last four steps */
  std::vector<kitty::static_truth_table<4>> y{steps[17], steps[18], steps[19], steps[20]};

  /* for each output ... */
  for ( auto i = 0; i < 4; ++i )
  {
    /* print hex representation of function */
    std::cout << "y" << ( i + 1 ) << " = " << kitty::to_hex( y[i] ) << "\n";

    /* print PPRM (algebraic normal form) as in Sect. 3 of the above cited
       paper */
    const auto cubes = esop_from_pprm( y[i] );
    kitty::print_cubes( cubes, 4 );
  }

  std::cout << std::flush;
}